

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlChar * xmlRelaxNGGetDataTypeLibrary(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlRelaxNGParserCtxtPtr pxVar2;
  bool bVar3;
  xmlChar *escape;
  xmlChar *ret;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else if ((((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
             (node->type != XML_ELEMENT_NODE)) ||
            ((iVar1 = xmlStrEqual(node->name,"data"), iVar1 == 0 ||
             (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)))) &&
           ((((node == (xmlNodePtr)0x0 ||
              ((node->ns == (xmlNs *)0x0 || (node->type != XML_ELEMENT_NODE)))) ||
             (iVar1 = xmlStrEqual(node->name,"value"), iVar1 == 0)) ||
            (iVar1 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar1 == 0)))) ||
          (ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlGetProp(node,(xmlChar *)"datatypeLibrary"),
          ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0)) {
    ret = (xmlChar *)node->parent;
    while( true ) {
      bVar3 = false;
      if (ret != (xmlChar *)0x0) {
        bVar3 = *(int *)(ret + 8) == 1;
      }
      if (!bVar3) {
        return (xmlChar *)0x0;
      }
      ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlGetProp((xmlNode *)ret,(xmlChar *)"datatypeLibrary");
      if (ctxt_local != (xmlRelaxNGParserCtxtPtr)0x0) break;
      ret = *(xmlChar **)(ret + 0x28);
    }
    if (*(xmlChar *)&ctxt_local->userData == '\0') {
      (*xmlFree)(ctxt_local);
      ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
    }
    else {
      pxVar2 = (xmlRelaxNGParserCtxtPtr)xmlURIEscapeStr((xmlChar *)ctxt_local,(xmlChar *)":/#?");
      if (pxVar2 != (xmlRelaxNGParserCtxtPtr)0x0) {
        (*xmlFree)(ctxt_local);
        ctxt_local = pxVar2;
      }
    }
  }
  else if (*(xmlChar *)&ctxt_local->userData == '\0') {
    (*xmlFree)(ctxt_local);
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    pxVar2 = (xmlRelaxNGParserCtxtPtr)xmlURIEscapeStr((xmlChar *)ctxt_local,(xmlChar *)":/#?");
    if (pxVar2 != (xmlRelaxNGParserCtxtPtr)0x0) {
      (*xmlFree)(ctxt_local);
      ctxt_local = pxVar2;
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
xmlRelaxNGGetDataTypeLibrary(xmlRelaxNGParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                             xmlNodePtr node)
{
    xmlChar *ret, *escape;

    if (node == NULL)
        return(NULL);

    if ((IS_RELAXNG(node, "data")) || (IS_RELAXNG(node, "value"))) {
        ret = xmlGetProp(node, BAD_CAST "datatypeLibrary");
        if (ret != NULL) {
            if (ret[0] == 0) {
                xmlFree(ret);
                return (NULL);
            }
            escape = xmlURIEscapeStr(ret, BAD_CAST ":/#?");
            if (escape == NULL) {
                return (ret);
            }
            xmlFree(ret);
            return (escape);
        }
    }
    node = node->parent;
    while ((node != NULL) && (node->type == XML_ELEMENT_NODE)) {
        ret = xmlGetProp(node, BAD_CAST "datatypeLibrary");
        if (ret != NULL) {
            if (ret[0] == 0) {
                xmlFree(ret);
                return (NULL);
            }
            escape = xmlURIEscapeStr(ret, BAD_CAST ":/#?");
            if (escape == NULL) {
                return (ret);
            }
            xmlFree(ret);
            return (escape);
        }
        node = node->parent;
    }
    return (NULL);
}